

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

shared_ptr<Token> __thiscall Tokenizer::nextToken(Tokenizer *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__args_4;
  element_type *peVar1;
  pointer psVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  element_type *peVar6;
  long extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_00;
  __shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  __shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<TokenizerRule> *rule;
  pointer psVar7;
  long lVar8;
  shared_ptr<Token> sVar9;
  __shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2> local_98;
  undefined4 local_84;
  element_type *local_80;
  undefined1 local_78 [8];
  string str;
  int local_44;
  __shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2> *local_40;
  int local_34 [2];
  TokenType matchTokenType;
  
  iVar4 = (*in_RSI->_M_ptr->_vptr_Readable[2])(in_RSI->_M_ptr,0);
  psVar2 = rules.
           super__Vector_base<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((char)iVar4 == '\0') {
    str.field_2._8_4_ = 1;
    local_34[0] = 0;
    local_44 = 0;
    local_84 = 0;
    std::make_shared<Token,char_const(&)[10],TokenType,int,int,int>
              ((char (*) [10])local_78,(TokenType *)"EndOfFile",
               (int *)(str.field_2._M_local_buf + 8),local_34,&stack0xffffffffffffffbc);
    this_00 = (__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *)&in_RSI[2]._M_refcount;
    std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,(__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&str);
  }
  else {
    local_34[0] = 0;
    lVar8 = 0;
    uVar5 = 0;
    psVar7 = rules.
             super__Vector_base<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_80 = (element_type *)this;
    local_40 = in_RSI;
    do {
      if (psVar7 == psVar2) break;
      peVar1 = (psVar7->super___shared_ptr<TokenizerRule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_98,local_40);
      uVar5 = (**peVar1->_vptr_TokenizerRule)(peVar1,&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
      local_34[0] = (*((psVar7->super___shared_ptr<TokenizerRule,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->_vptr_TokenizerRule[1])();
      psVar7 = psVar7 + 1;
      lVar8 = extraout_RDX;
    } while ((uVar5 & 1) == 0);
    this = (Tokenizer *)local_80;
    if ((((uVar5 & 1) == 0) || (lVar8 == 0)) || (local_34[0] == 0)) {
      iVar4 = (*local_40->_M_ptr->_vptr_Readable[2])(local_40->_M_ptr,0);
      local_78 = (undefined1  [8])&str._M_string_length;
      str._M_string_length._0_1_ = (undefined1)iVar4;
      str._M_dataplus._M_p = (pointer)0x1;
      local_44 = 0;
      str._M_string_length._1_1_ = 0;
      std::
      make_shared<Token,std::__cxx11::string,TokenType,unsigned_long&,unsigned_long&,unsigned_long&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&str.field_2 + 8),(TokenType *)local_78,
                 (unsigned_long *)&stack0xffffffffffffffbc,(unsigned_long *)(local_40 + 1),
                 (unsigned_long *)&local_40[1]._M_refcount);
      std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *)&local_40[2]._M_refcount,
                 (__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *)((long)&str.field_2 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0);
      std::__cxx11::string::~string((string *)local_78);
      local_40[1]._M_ptr = (element_type *)((long)&(local_40[1]._M_ptr)->_vptr_Readable + 1);
      local_40[2]._M_ptr = (element_type *)((long)&(local_40[2]._M_ptr)->_vptr_Readable + 1);
      (*local_40->_M_ptr->_vptr_Readable[3])(local_40->_M_ptr,1);
    }
    else {
      (*local_40->_M_ptr->_vptr_Readable[5])(local_78,local_40->_M_ptr,lVar8);
      __args_4 = &local_40[1]._M_refcount;
      std::
      make_shared<Token,std::__cxx11::string&,TokenType&,unsigned_long&,unsigned_long&,unsigned_long&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&str.field_2 + 8),(TokenType *)local_78,(unsigned_long *)local_34,
                 (unsigned_long *)(local_40 + 1),(unsigned_long *)__args_4);
      std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *)&local_40[2]._M_refcount,
                 (__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *)((long)&str.field_2 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0);
      bVar3 = Token::isNewLine((string *)local_78);
      if (bVar3) {
        __args_4->_M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&__args_4->_M_pi->_vptr__Sp_counted_base + 1);
        peVar6 = (element_type *)0x1;
      }
      else {
        peVar6 = (element_type *)((long)&(local_40[2]._M_ptr)->_vptr_Readable + lVar8);
      }
      local_40[2]._M_ptr = peVar6;
      local_40[1]._M_ptr = (element_type *)((long)&(local_40[1]._M_ptr)->_vptr_Readable + lVar8);
      (*local_40->_M_ptr->_vptr_Readable[3])(local_40->_M_ptr,lVar8);
      std::__cxx11::string::~string((string *)local_78);
    }
    this_00 = (__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *)&local_40[2]._M_refcount;
  }
  std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  sVar9.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX_00._M_pi;
  sVar9.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Token>)sVar9.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Token> Tokenizer::nextToken() noexcept {

  if (this->reader->charAt(0) == '\0') {
    this->token = std::make_shared<Token>("EndOfFile", TokenType::EndOfFile, 0, 0, 0);
    return this->token;
  }

  bool match = false;
  std::size_t matchSize = 0;
  TokenType matchTokenType = TokenType::Unknown;

  for (auto & rule : rules) {
    auto result = rule->tryMatch(this->reader);

    match = result.first;
    matchSize = result.second;
    matchTokenType = rule->getType();

    if (match) { break; }
  }

  if (match && matchSize > 0 && matchTokenType != TokenType::Unknown) {

    std::string str = this->reader->subString(matchSize);

    this->token = std::make_shared<Token>(
      str, matchTokenType, this->sourceIndex, this->sourceLine, this->sourceColumn);

    if (Token::isNewLine(str)) {
      this->sourceColumn = 1;
      this->sourceLine += 1;
    } else {
      this->sourceColumn += matchSize;
    }

    this->sourceIndex += matchSize;

    this->reader->advance(matchSize);

  } else {

    this->token = std::make_shared<Token>(
      std::string{this->reader->charAt(0)}, TokenType::Unknown,
      this->sourceIndex, this->sourceLine, this->sourceColumn);

    this->sourceIndex++;
    this->sourceColumn++;

    this->reader->advance(1);
  }

  return this->token;
}